

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

void __thiscall
HighsLpRelaxation::getCutPool
          (HighsLpRelaxation *this,HighsInt *num_col,HighsInt *num_cut,
          vector<double,_std::allocator<double>_> *cut_lower,
          vector<double,_std::allocator<double>_> *cut_upper,HighsSparseMatrix *cut_matrix)

{
  pointer pdVar1;
  pointer pdVar2;
  uint *puVar3;
  pointer piVar4;
  vector<double,_std::allocator<double>_> *this_00;
  pointer pLVar5;
  size_type sVar6;
  size_type __new_size;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  vector<int,_std::allocator<int>_> cut_matrix_length;
  vector<int,_std::allocator<int>_> cut_row_index;
  HighsLp lp;
  vector<int,_std::allocator<int>_> local_418;
  vector<int,_std::allocator<int>_> local_3f8;
  vector<double,_std::allocator<double>_> *local_3d8;
  value_type_conflict2 local_3cc;
  HighsLp local_3c8;
  
  local_3d8 = cut_upper;
  HighsLp::HighsLp(&local_3c8,&(this->lpsolver).model_.lp_);
  this_00 = local_3d8;
  *num_col = local_3c8.num_col_;
  sVar6 = (size_type)local_3c8.num_row_;
  __new_size = sVar6 - (long)this->mipsolver->model_->num_row_;
  *num_cut = (HighsInt)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(cut_lower,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)*num_cut);
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_3f8,sVar6,(value_type_conflict2 *)&local_418);
  if (0 < local_3c8.num_row_) {
    pLVar5 = (this->lprows).
             super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (cut_lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    iVar10 = 0;
    do {
      if (pLVar5->origin == kCutPool) {
        local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = iVar10;
        pdVar1[iVar10] =
             local_3c8.row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        pdVar2[iVar10] =
             local_3c8.row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        iVar10 = iVar10 + 1;
      }
      lVar9 = lVar9 + 1;
      pLVar5 = pLVar5 + 1;
    } while (lVar9 < local_3c8.num_row_);
  }
  cut_matrix->num_col_ = local_3c8.num_col_;
  cut_matrix->num_row_ = *num_cut;
  cut_matrix->format_ = kRowwise;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3cc = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_418,(long)*num_cut,&local_3cc);
  if (0 < local_3c8.num_col_) {
    lVar9 = 0;
    do {
      lVar8 = (long)local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar9];
      lVar7 = lVar9 + 1;
      if (local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] <
          local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9 + 1]) {
        do {
          if (-1 < (long)local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [local_3c8.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8]]) {
            local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_3c8.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar8]]] =
                 local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [local_3c8.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8]]] + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar7]);
      }
      lVar9 = lVar7;
    } while (lVar7 < local_3c8.num_col_);
  }
  std::vector<int,_std::allocator<int>_>::resize(&cut_matrix->start_,(long)*num_cut + 1);
  puVar3 = (uint *)(cut_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  *puVar3 = 0;
  uVar12 = 0;
  if (*num_cut < 1) {
    sVar6 = 0;
  }
  else {
    sVar6 = (size_type)*puVar3;
    lVar9 = 0;
    do {
      iVar10 = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9];
      local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = (int)sVar6;
      sVar6 = (long)(int)uVar12 + (long)iVar10;
      uVar12 = (uint)sVar6;
      puVar3[lVar9 + 1] = uVar12;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *num_cut);
  }
  std::vector<int,_std::allocator<int>_>::resize(&cut_matrix->index_,sVar6);
  std::vector<double,_std::allocator<double>_>::resize(&cut_matrix->value_,sVar6);
  if (0 < local_3c8.num_col_) {
    lVar9 = 0;
    do {
      lVar8 = (long)local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar9];
      lVar7 = lVar9 + 1;
      if (local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] <
          local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9 + 1]) {
        piVar4 = (cut_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar1 = (cut_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          lVar11 = (long)local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [local_3c8.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8]];
          if (-1 < lVar11) {
            piVar4[local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]] = (int)lVar9;
            iVar10 = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
            pdVar1[iVar10] =
                 local_3c8.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar8];
            local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = iVar10 + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_3c8.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar7]);
      }
      lVar9 = lVar7;
    } while (lVar7 < local_3c8.num_col_);
  }
  if (local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLp::~HighsLp(&local_3c8);
  return;
}

Assistant:

void HighsLpRelaxation::getCutPool(HighsInt& num_col, HighsInt& num_cut,
                                   std::vector<double>& cut_lower,
                                   std::vector<double>& cut_upper,
                                   HighsSparseMatrix& cut_matrix) const {
  // NB RESTORE reference
  //  const HighsLp& lp = lpsolver.getLp();
  HighsLp lp = lpsolver.getLp();
  num_col = lp.num_col_;
  HighsInt num_lp_row = lp.num_row_;
  HighsInt num_model_row = mipsolver.numRow();
  num_cut = num_lp_row - num_model_row;
  cut_lower.resize(num_cut);
  cut_upper.resize(num_cut);
  // Get a map from row index to cut row index
  std::vector<HighsInt> cut_row_index;
  cut_row_index.assign(num_lp_row, -1);
  HighsInt cut_num = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lprows[iRow].origin != LpRow::Origin::kCutPool) continue;
    cut_row_index[iRow] = cut_num;
    cut_lower[cut_num] = lp.row_lower_[iRow];
    cut_upper[cut_num] = lp.row_upper_[iRow];
    cut_num++;
  }
  assert(cut_num == num_cut);

  cut_matrix.num_col_ = lp.num_col_;
  cut_matrix.num_row_ = num_cut;
  cut_matrix.format_ = MatrixFormat::kRowwise;

  std::vector<HighsInt> cut_matrix_length;
  cut_matrix_length.assign(num_cut, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
      HighsInt iCut = cut_row_index[lp.a_matrix_.index_[iEl]];
      if (iCut >= 0) cut_matrix_length[iCut]++;
    }
  }
  cut_matrix.start_.resize(num_cut + 1);
  cut_matrix.start_[0] = 0;
  HighsInt num_cut_nz = 0;
  for (HighsInt iCut = 0; iCut < num_cut; iCut++) {
    HighsInt length = cut_matrix_length[iCut];
    cut_matrix_length[iCut] = cut_matrix.start_[iCut];
    num_cut_nz += length;
    cut_matrix.start_[iCut + 1] = num_cut_nz;
  }
  cut_matrix.index_.resize(num_cut_nz);
  cut_matrix.value_.resize(num_cut_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++) {
      HighsInt iCut = cut_row_index[lp.a_matrix_.index_[iEl]];
      if (iCut >= 0) {
        cut_matrix.index_[cut_matrix_length[iCut]] = iCol;
        cut_matrix.value_[cut_matrix_length[iCut]] = lp.a_matrix_.value_[iEl];
        cut_matrix_length[iCut]++;
      }
    }
  }
}